

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<float,deqp::gls::BuiltinPrecisionTests::Void>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  FloatFormat *fmt;
  float fVar1;
  pointer pVVar2;
  pointer pVVar3;
  Variable<tcu::Vector<float,_3>_> *pVVar4;
  pointer pcVar5;
  Variable<float> *pVVar6;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pVVar7;
  bool bVar8;
  ContextType type;
  int iVar9;
  undefined8 uVar10;
  char *pcVar11;
  size_t sVar12;
  long *plVar13;
  ShaderExecutor *pSVar14;
  long lVar15;
  IVal *pIVar16;
  IVal *x;
  TestError *this_00;
  uint uVar17;
  TestLog *pTVar18;
  long lVar19;
  Vector<float,_3> *pVVar20;
  ulong uVar21;
  MessageBuilder *pMVar22;
  ulong uVar23;
  PrecisionCase *pPVar24;
  long lVar25;
  IVal IVar26;
  byte bVar27;
  double dVar28;
  double dVar29;
  IVal reference1;
  FuncSet funcs;
  IVal in2;
  IVal in3;
  ostringstream os;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  outputs;
  FloatFormat highpFmt;
  ostringstream oss;
  ShaderSpec spec;
  undefined1 auStack_508 [15];
  IVal local_4f9;
  undefined1 local_4f8 [8];
  undefined8 local_4f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8;
  _Rb_tree_node_base *local_4d8;
  size_t local_4d0;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_4c8;
  PrecisionCase *local_4c0;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_4b8;
  Statement *local_4b0;
  string local_4a8;
  ulong local_488;
  ulong local_480;
  IVal local_478;
  undefined8 uStack_460;
  undefined1 local_458 [8];
  undefined1 auStack_450 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  double local_438;
  Data local_430;
  undefined4 local_420;
  ios_base local_3e8 [8];
  ios_base local_3e0 [272];
  ulong local_2d0;
  ulong local_2c8;
  ResultCollector *local_2c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2b8;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  local_288;
  FloatFormat local_258;
  undefined8 uStack_230;
  undefined1 local_228 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218 [6];
  ios_base local_1b8 [272];
  undefined1 local_a8 [56];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  bVar27 = 0;
  pVVar2 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar21 = ((long)pVVar3 - (long)pVVar2 >> 2) * -0x5555555555555555;
  local_4c8 = variables;
  local_4b8 = inputs;
  local_4b0 = stmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Outputs(&local_288,uVar21);
  local_70._M_p = (pointer)&local_60;
  local_a8._0_4_ = GLSL_VERSION_300_ES;
  local_a8._8_8_ = (pointer)0x0;
  local_a8._16_8_ = (pointer)0x0;
  local_a8._24_8_ = (pointer)0x0;
  local_a8._32_8_ = (pointer)0x0;
  local_a8._40_8_ = (pointer)0x0;
  local_a8._48_8_ = (pointer)0x0;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_258.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_258.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_258.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_258.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_258.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_258.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_258.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_258.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_258._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2b8._M_impl.super__Rb_tree_header._M_header;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_458 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2b8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_450);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450,"Statement: ",0xb);
  (*local_4b0->_vptr_Statement[2])(local_4b0,(ostringstream *)auStack_450);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_4c0 = this;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_450);
  std::ios_base::~ios_base(local_3e0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
  local_4f0 = (double)((ulong)local_4f0._4_4_ << 0x20);
  local_4e8._M_allocated_capacity = 0;
  local_4d0 = 0;
  local_4e8._8_8_ = (_Rb_tree_node_base *)&local_4f0;
  local_4d8 = (_Rb_tree_node_base *)&local_4f0;
  (*local_4b0->_vptr_Statement[4])(local_4b0,local_4f8);
  if ((_Rb_tree_node_base *)local_4e8._8_8_ != (_Rb_tree_node_base *)&local_4f0) {
    uVar10 = local_4e8._8_8_;
    do {
      (**(code **)(**(long **)(uVar10 + 0x20) + 0x30))(*(long **)(uVar10 + 0x20),local_228);
      uVar10 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar10);
    } while ((_Rb_tree_node_base *)uVar10 != (_Rb_tree_node_base *)&local_4f0);
  }
  pPVar24 = local_4c0;
  if (local_4d0 != 0) {
    local_458 = (undefined1  [8])((local_4c0->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_450);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_450,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_450,local_4a8._M_dataplus._M_p,local_4a8._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_450);
    std::ios_base::~ios_base(local_3e0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_4f8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
  std::ios_base::~ios_base(local_1b8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"precision ",10);
  pcVar11 = glu::getPrecisionName((pPVar24->m_ctx).precision);
  if (pcVar11 == (char *)0x0) {
    std::ios::clear((int)(auStack_508 + (long)((TestLog *)((long)local_458 + -0x18))->m_log) + 0xb0)
    ;
  }
  else {
    sVar12 = strlen(pcVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,pcVar11,sVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_70,(string *)local_228);
  if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
    operator_delete((void *)local_228._0_8_,local_218[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
  std::ios_base::~ios_base(local_3e8);
  type.super_ApiType.m_bits = (ApiType)(*((pPVar24->m_ctx).renderContext)->_vptr_RenderContext[2])()
  ;
  local_a8._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((pPVar24->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228,
                   "#extension ",&pPVar24->m_extension);
    plVar13 = (long *)std::__cxx11::string::append(local_228);
    pTVar18 = (TestLog *)(plVar13 + 2);
    if ((TestLog *)*plVar13 == pTVar18) {
      local_448._M_allocated_capacity = (size_type)pTVar18->m_log;
      local_448._8_8_ = plVar13[3];
      local_458 = (undefined1  [8])(auStack_450 + 8);
    }
    else {
      local_448._M_allocated_capacity = (size_type)pTVar18->m_log;
      local_458 = (undefined1  [8])*plVar13;
    }
    auStack_450 = (undefined1  [8])plVar13[1];
    *plVar13 = (long)pTVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_70,(string *)local_458);
    if (local_458 != (undefined1  [8])(auStack_450 + 8)) {
      operator_delete((void *)local_458,(ulong)(local_448._M_allocated_capacity + 1));
    }
    pPVar24 = local_4c0;
    if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
      operator_delete((void *)local_228._0_8_,local_218[0]._M_allocated_capacity + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_a8 + 8),2);
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_458,pPVar24,
             (local_4c8->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar10 = local_a8._8_8_;
  std::__cxx11::string::operator=((string *)(local_a8._8_8_ + 0x38),(string *)local_458);
  glu::VarType::operator=(&((pointer)(uVar10 + 0x38))->varType,(VarType *)&local_438);
  glu::VarType::~VarType((VarType *)&local_438);
  if (local_458 != (undefined1  [8])(auStack_450 + 8)) {
    operator_delete((void *)local_458,(ulong)(local_448._M_allocated_capacity + 1));
  }
  makeSymbol<tcu::Vector<float,3>>
            ((Symbol *)local_458,pPVar24,
             (local_4c8->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
             .m_ptr);
  uVar10 = local_a8._8_8_;
  std::__cxx11::string::operator=((string *)local_a8._8_8_,(string *)local_458);
  glu::VarType::operator=((VarType *)(uVar10 + 0x20),(VarType *)&local_438);
  glu::VarType::~VarType((VarType *)&local_438);
  if (local_458 != (undefined1  [8])(auStack_450 + 8)) {
    operator_delete((void *)local_458,(ulong)(local_448._M_allocated_capacity + 1));
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_a8 + 0x20),1);
  makeSymbol<float>((Symbol *)local_458,pPVar24,
                    (local_4c8->out0).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar10 = local_a8._32_8_;
  std::__cxx11::string::operator=((string *)local_a8._32_8_,(string *)local_458);
  glu::VarType::operator=((VarType *)(uVar10 + 0x20),(VarType *)&local_438);
  glu::VarType::~VarType((VarType *)&local_438);
  if (local_458 != (undefined1  [8])(auStack_450 + 8)) {
    operator_delete((void *)local_458,(ulong)(local_448._M_allocated_capacity + 1));
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
  (*local_4b0->_vptr_Statement[2])(local_4b0,local_458);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
  std::ios_base::~ios_base(local_3e8);
  std::__cxx11::string::operator=((string *)&local_50,(string *)local_228);
  if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
    operator_delete((void *)local_228._0_8_,local_218[0]._M_allocated_capacity + 1);
  }
  pSVar14 = ShaderExecUtil::createExecutor
                      ((pPVar24->m_ctx).renderContext,(pPVar24->m_ctx).shaderType,
                       (ShaderSpec *)local_a8);
  local_458 = (undefined1  [8])
              (local_4b8->in0).
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  auStack_450 = (undefined1  [8])
                (local_4b8->in1).
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_448._M_allocated_capacity =
       (size_type)
       (local_4b8->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_448._8_8_ =
       (local_4b8->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_228._0_8_ =
       local_288.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_228._8_8_ =
       local_288.out1.
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (*pSVar14->_vptr_ShaderExecutor[3])
            (pSVar14,((pPVar24->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar9 = (*pSVar14->_vptr_ShaderExecutor[2])(pSVar14);
  if ((char)iVar9 != '\0') {
    (*pSVar14->_vptr_ShaderExecutor[5])(pSVar14);
    (*pSVar14->_vptr_ShaderExecutor[6])(pSVar14,uVar21 & 0xffffffff,local_458,local_228);
    fmt = &(pPVar24->m_ctx).floatFormat;
    (*pSVar14->_vptr_ShaderExecutor[1])(pSVar14);
    pVVar7 = local_4c8;
    lVar15 = 0x10;
    do {
      *(undefined1 *)((long)&local_478.m_hi + lVar15) = 0;
      *(undefined8 *)((long)&uStack_460 + lVar15) = 0x7ff0000000000000;
      *(undefined8 *)(local_458 + lVar15) = 0xfff0000000000000;
      lVar15 = lVar15 + 0x18;
    } while (lVar15 != 0x58);
    lVar15 = 0x10;
    do {
      *(undefined1 *)((long)&local_478.m_hi + lVar15) = 0;
      *(undefined8 *)((long)&uStack_460 + lVar15) = 0x7ff0000000000000;
      *(undefined8 *)(local_458 + lVar15) = 0xfff0000000000000;
      lVar15 = lVar15 + 0x18;
    } while (lVar15 != 0x58);
    lVar15 = 0x10;
    do {
      *(undefined1 *)((long)&local_258.m_maxValue + lVar15) = 0;
      *(undefined8 *)((long)&uStack_230 + lVar15) = 0x7ff0000000000000;
      *(undefined8 *)(local_228 + lVar15) = 0xfff0000000000000;
      lVar15 = lVar15 + 0x18;
    } while (lVar15 != 0x58);
    lVar15 = 0x10;
    do {
      *(undefined1 *)((long)&local_258.m_maxValue + lVar15) = 0;
      *(undefined8 *)((long)&uStack_230 + lVar15) = 0x7ff0000000000000;
      *(undefined8 *)(local_228 + lVar15) = 0xfff0000000000000;
      lVar15 = lVar15 + 0x18;
    } while (lVar15 != 0x58);
    local_4f8 = (undefined1  [8])((ulong)local_4f8 & 0xffffffffffffff00);
    local_4f0 = INFINITY;
    local_4e8._M_allocated_capacity = 0xfff0000000000000;
    Environment::bind<tcu::Vector<float,3>>
              ((Environment *)&local_2b8,
               (local_4c8->in0).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
               .m_ptr,(IVal *)local_458);
    Environment::bind<tcu::Vector<float,3>>
              ((Environment *)&local_2b8,
               (pVVar7->in1).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
               .m_ptr,(IVal *)local_228);
    Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
              ((Environment *)&local_2b8,
               (pVVar7->in2).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
               .m_ptr,(IVal *)&local_4a8);
    Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
              ((Environment *)&local_2b8,
               (pVVar7->in3).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
               .m_ptr,(IVal *)&local_478);
    Environment::bind<float>
              ((Environment *)&local_2b8,
               (pVVar7->out0).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
               (IVal *)local_4f8);
    Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
              ((Environment *)&local_2b8,
               (pVVar7->out1).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
               .m_ptr,&local_4f9);
    local_2d0 = uVar21;
    if (pVVar3 == pVVar2) {
      uVar21 = 0;
    }
    else {
      local_2c0 = &pPVar24->m_status;
      local_2c8 = uVar21 + (uVar21 == 0);
      lVar25 = 0;
      lVar15 = 0;
      uVar23 = 0;
      uVar21 = 0;
      do {
        local_478._0_8_ = local_478._0_8_ & 0xffffffffffffff00;
        local_478.m_lo = INFINITY;
        local_478.m_hi = -INFINITY;
        local_488 = uVar21;
        if ((uVar23 & 0xfff) == 0) {
          tcu::TestContext::touchWatchdog((local_4c0->super_TestCase).super_TestNode.m_testCtx);
        }
        pVVar2 = (local_4b8->in0).
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_4f8 = *(undefined1 (*) [8])((long)pVVar2->m_data + lVar15);
        local_480 = uVar23;
        local_4f0._0_4_ = *(float *)((long)pVVar2->m_data + lVar15 + 8);
        ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                  ((IVal *)local_228,fmt,(Vector<float,_3> *)local_4f8);
        pVVar7 = local_4c8;
        ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                  ((IVal *)local_458,fmt,(IVal *)local_228);
        pIVar16 = Environment::lookup<tcu::Vector<float,3>>
                            ((Environment *)&local_2b8,
                             (pVVar7->in0).
                             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                             .m_ptr);
        pMVar22 = (MessageBuilder *)local_458;
        for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
          *(TestLog **)pIVar16->m_data = pMVar22->m_log;
          pMVar22 = (MessageBuilder *)((long)pMVar22 + (ulong)bVar27 * -0x10 + 8);
          pIVar16 = (IVal *)((long)pIVar16 + ((ulong)bVar27 * -2 + 1) * 8);
        }
        pVVar2 = (local_4b8->in1).
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_4f0 = (double)CONCAT44(local_4f0._4_4_,
                                     *(undefined4 *)((long)pVVar2->m_data + lVar15 + 8));
        local_4f8 = *(undefined1 (*) [8])((long)pVVar2->m_data + lVar15);
        ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                  ((IVal *)local_228,fmt,(Vector<float,_3> *)local_4f8);
        ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                  ((IVal *)local_458,fmt,(IVal *)local_228);
        pIVar16 = Environment::lookup<tcu::Vector<float,3>>
                            ((Environment *)&local_2b8,
                             (pVVar7->in1).
                             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                             .m_ptr);
        pMVar22 = (MessageBuilder *)local_458;
        for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
          *(TestLog **)pIVar16->m_data = pMVar22->m_log;
          pMVar22 = (MessageBuilder *)((long)pMVar22 + (ulong)bVar27 * -0x10 + 8);
          pIVar16 = (IVal *)((long)pIVar16 + ((ulong)bVar27 * -2 + 1) * 8);
        }
        Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                  ((Environment *)&local_2b8,
                   (pVVar7->in2).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                   .m_ptr);
        Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                  ((Environment *)&local_2b8,
                   (pVVar7->in3).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                   .m_ptr);
        local_430.basic.type = (local_4c0->m_ctx).precision;
        local_438 = (pPVar24->m_ctx).floatFormat.m_maxValue;
        local_458 = *(undefined1 (*) [8])fmt;
        auStack_450 = *(undefined1 (*) [8])&(pPVar24->m_ctx).floatFormat.m_fractionBits;
        local_448._M_allocated_capacity = *(undefined8 *)&(pPVar24->m_ctx).floatFormat.m_hasInf;
        local_448._8_8_ = *(undefined8 *)&(pPVar24->m_ctx).floatFormat.m_exactPrecision;
        local_420 = 0;
        local_430._8_8_ = &local_2b8;
        (*local_4b0->_vptr_Statement[3])(local_4b0,(MessageBuilder *)local_458);
        x = Environment::lookup<float>
                      ((Environment *)&local_2b8,
                       (pVVar7->out0).
                       super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.
                       m_ptr);
        tcu::FloatFormat::convert((Interval *)local_458,&local_258,x);
        uVar23 = local_480;
        local_478.m_hi = (double)local_448._M_allocated_capacity;
        local_478._0_8_ = local_458;
        uVar10 = local_478._0_8_;
        local_478.m_lo = (double)auStack_450;
        fVar1 = local_288.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[local_480];
        dVar28 = (double)fVar1;
        dVar29 = dVar28;
        if (NAN(fVar1)) {
          dVar29 = INFINITY;
          dVar28 = -INFINITY;
        }
        IVar26 = (IVal)(dVar28 <= (double)local_448._M_allocated_capacity &&
                       (double)auStack_450 <= dVar29);
        if ((NAN(fVar1)) &&
           (dVar28 <= (double)local_448._M_allocated_capacity && (double)auStack_450 <= dVar29)) {
          local_478.m_hasNaN = local_458[0];
          IVar26 = (IVal)local_478.m_hasNaN;
        }
        local_458 = (undefined1  [8])(auStack_450 + 8);
        local_478._0_8_ = uVar10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_458,"Shader output 0 is outside acceptable range","");
        bVar8 = tcu::ResultCollector::check(local_2c0,(bool)((byte)IVar26 & 1),(string *)local_458);
        if (local_458 != (undefined1  [8])(auStack_450 + 8)) {
          operator_delete((void *)local_458,(ulong)(local_448._M_allocated_capacity + 1));
        }
        uVar17 = (int)local_488 + ((byte)~bVar8 & 1);
        uVar21 = (ulong)uVar17;
        if ((int)uVar17 < 0x65 && !bVar8) {
          local_458 = (undefined1  [8])((local_4c0->super_TestCase).super_TestNode.m_testCtx)->m_log
          ;
          local_488 = (ulong)uVar17;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_450);
          pcVar11 = "Failed";
          if (bVar8) {
            pcVar11 = "Passed";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450,pcVar11,6);
          pVVar7 = local_4c8;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450,"\t",1);
          pVVar4 = (pVVar7->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                   .m_ptr;
          pVVar20 = (Vector<float,_3> *)(local_228 + 0x10);
          pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
          local_228._0_8_ = pVVar20;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_228,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_450,(char *)local_228._0_8_,local_228._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450," = ",3);
          valueToString<tcu::Vector<float,3>>
                    ((string *)local_4f8,(BuiltinPrecisionTests *)&local_258,
                     (FloatFormat *)
                     ((long)((local_4b8->in0).
                             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar15),pVVar20);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_450,(char *)local_4f8,(long)local_4f0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450,"\n",1);
          if (local_4f8 != (undefined1  [8])&local_4e8) {
            operator_delete((void *)local_4f8,(ulong)(local_4e8._M_allocated_capacity + 1));
          }
          if ((Vector<float,_3> *)local_228._0_8_ != (Vector<float,_3> *)(local_228 + 0x10)) {
            operator_delete((void *)local_228._0_8_,local_218[0]._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450,"\t",1);
          pVVar4 = (pVVar7->in1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
                   .m_ptr;
          pVVar20 = (Vector<float,_3> *)(local_228 + 0x10);
          pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
          local_228._0_8_ = pVVar20;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_228,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_450,(char *)local_228._0_8_,local_228._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450," = ",3);
          valueToString<tcu::Vector<float,3>>
                    ((string *)local_4f8,(BuiltinPrecisionTests *)&local_258,
                     (FloatFormat *)
                     ((long)((local_4b8->in1).
                             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar15),pVVar20);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_450,(char *)local_4f8,(long)local_4f0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450,"\n",1);
          if (local_4f8 != (undefined1  [8])&local_4e8) {
            operator_delete((void *)local_4f8,(ulong)(local_4e8._M_allocated_capacity + 1));
          }
          if ((Vector<float,_3> *)local_228._0_8_ != (Vector<float,_3> *)(local_228 + 0x10)) {
            operator_delete((void *)local_228._0_8_,local_218[0]._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450,"\t",1);
          pVVar6 = (pVVar7->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
          local_228._0_8_ = local_228 + 0x10;
          pcVar5 = (pVVar6->m_name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_228,pcVar5,pcVar5 + (pVVar6->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_450,(char *)local_228._0_8_,local_228._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450," = ",3);
          valueToString<float>
                    ((string *)local_4f8,&local_258,
                     (float *)((long)local_288.out0.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar25));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_450,(char *)local_4f8,(long)local_4f0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_450,"\tExpected range: ",0x11);
          intervalToString<float>(&local_4a8,&local_258,&local_478);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_450,local_4a8._M_dataplus._M_p,local_4a8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
            operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
          }
          if (local_4f8 != (undefined1  [8])&local_4e8) {
            operator_delete((void *)local_4f8,(ulong)(local_4e8._M_allocated_capacity + 1));
          }
          if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
            operator_delete((void *)local_228._0_8_,local_218[0]._M_allocated_capacity + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_450);
          std::ios_base::~ios_base(local_3e0);
          uVar21 = local_488;
          uVar23 = local_480;
        }
        uVar23 = uVar23 + 1;
        lVar15 = lVar15 + 0xc;
        lVar25 = lVar25 + 4;
      } while (local_2c8 != uVar23);
    }
    pPVar24 = local_4c0;
    iVar9 = (int)uVar21;
    if (100 < iVar9) {
      local_458 = (undefined1  [8])((local_4c0->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_450);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)auStack_450,iVar9 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_450);
      std::ios_base::~ios_base(local_3e0);
    }
    if (iVar9 == 0) {
      local_458 = (undefined1  [8])((pPVar24->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_450);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450,"All ",4);
      std::ostream::_M_insert<unsigned_long>((ulong)auStack_450);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_450," inputs passed.",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_458 = (undefined1  [8])((pPVar24->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_450);
      std::ostream::operator<<((ostringstream *)auStack_450,iVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_450,"/",1);
      std::ostream::_M_insert<unsigned_long>((ulong)auStack_450);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_450," inputs failed.",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_450);
    std::ios_base::~ios_base(local_3e0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
    ::~_Rb_tree(&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,
                      CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,
                      CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) + 1);
    }
    std::
    vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>::
    ~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_a8 + 0x20));
    std::
    vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>::
    ~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_a8 + 8));
    if (local_288.out1.
        super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_288.out1.
                      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_288.out1.
                            super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_288.out1.
                            super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_288.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_288.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_288.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_288.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Shader compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
             ,0x11d4);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}